

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O2

VRDisplayNode *
MinVR::VRGraphicsWindowNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VRAnyCoreType VVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  VRGraphicsWindowNode *this;
  string local_440;
  string local_420;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  VRWindowSettings settings;
  string wtk;
  string gtk;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string nodeNameSpace;
  
  std::__cxx11::string::string((string *)&nodeNameSpace,(string *)nameSpace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings,"GraphicsToolkit",(allocator<char> *)&wtk);
  std::__cxx11::string::string((string *)&local_70,(string *)&nodeNameSpace);
  VVar4 = VRDataIndex::getValue(config,(string *)&settings,&local_70,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&gtk,VVar4.datum);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&settings);
  iVar1 = (*vrMain->_vptr_VRMainInterface[5])(vrMain,&gtk);
  if ((VRGraphicsToolkit *)CONCAT44(extraout_var,iVar1) == (VRGraphicsToolkit *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot get the graphics toolkit named: ");
    poVar5 = std::operator<<(poVar5,(string *)&gtk);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&settings,"WindowToolkit",(allocator<char> *)&local_440);
  std::__cxx11::string::string((string *)&local_90,(string *)nameSpace);
  VVar4 = VRDataIndex::getValue(config,(string *)&settings,&local_90,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&wtk,VVar4.datum);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&settings);
  iVar2 = (*vrMain->_vptr_VRMainInterface[6])(vrMain,&wtk);
  if ((VRWindowToolkit *)CONCAT44(extraout_var_00,iVar2) == (VRWindowToolkit *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot get the window toolkit named: ");
    poVar5 = std::operator<<(poVar5,(string *)&wtk);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  settings.caption._M_dataplus._M_p = (pointer)&settings.caption.field_2;
  settings.caption._M_string_length = 0;
  settings.caption.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"XPos",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 100;
  std::__cxx11::string::string((string *)&local_b0,(string *)nameSpace);
  settings.xpos =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_b0,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"YPos",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 100;
  std::__cxx11::string::string((string *)&local_d0,(string *)nameSpace);
  settings.ypos =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_d0,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Width",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0x280;
  std::__cxx11::string::string((string *)&local_f0,(string *)nameSpace);
  settings.width =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_f0,true);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Height",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0x280;
  std::__cxx11::string::string((string *)&local_110,(string *)nameSpace);
  settings.height =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_110,true);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Border",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_130,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_130,true)
  ;
  settings.border = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Visible",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_150,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_150,true)
  ;
  settings.visible = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"Caption",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"MinVR Window",&local_3fa)
  ;
  std::__cxx11::string::string((string *)&local_170,(string *)nameSpace);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&local_440,config,&local_420,&local_3f8,&local_170,true);
  std::__cxx11::string::operator=((string *)&settings.caption,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"QuadBuffered",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_190,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_190,true)
  ;
  settings.quadBuffered = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"SharedContextGroupID",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)&local_1b0,(string *)nameSpace);
  settings.sharedContextGroupID =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_1b0,true);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"ContextVersionMajor",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 1;
  std::__cxx11::string::string((string *)&local_1d0,(string *)nameSpace);
  settings.contextVersionMajor =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_1d0,true);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"ContextVersionMinor",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 2;
  std::__cxx11::string::string((string *)&local_1f0,(string *)nameSpace);
  settings.contextVersionMinor =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_1f0,true);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"RGBBits",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 8;
  std::__cxx11::string::string((string *)&local_210,(string *)nameSpace);
  settings.rgbBits =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_210,true);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"AlphaBits",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 8;
  std::__cxx11::string::string((string *)&local_230,(string *)nameSpace);
  settings.alphaBits =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_230,true);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"DepthBits",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0x18;
  std::__cxx11::string::string((string *)&local_250,(string *)nameSpace);
  settings.depthBits =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_250,true);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"StencilBits",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 8;
  std::__cxx11::string::string((string *)&local_270,(string *)nameSpace);
  settings.stencilBits =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_270,true);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"FullScreen",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_290,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_290,true)
  ;
  settings.fullScreen = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Resizable",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 1;
  std::__cxx11::string::string((string *)&local_2b0,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_2b0,true)
  ;
  settings.resizable = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"AllowMaximize",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 1;
  std::__cxx11::string::string((string *)&local_2d0,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_2d0,true)
  ;
  settings.allowMaximize = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"UseGPUAffinity",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 1;
  std::__cxx11::string::string((string *)&local_2f0,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_2f0,true)
  ;
  settings.gpuAffinity = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"UseDebugContext",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_310,(string *)nameSpace);
  iVar3 = VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_310,true)
  ;
  settings.debugContext = iVar3 != 0;
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"MSAASamples",(allocator<char> *)&local_3f8);
  local_420._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_330,(string *)nameSpace);
  settings.msaaSamples =
       VRDataIndex::getValueWithDefault<int>(config,&local_440,(int *)&local_420,&local_330,true);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_440);
  this = (VRGraphicsWindowNode *)operator_new(0xf8);
  VRGraphicsWindowNode
            (this,nameSpace,(VRGraphicsToolkit *)CONCAT44(extraout_var,iVar1),
             (VRWindowToolkit *)CONCAT44(extraout_var_00,iVar2),&settings);
  std::__cxx11::string::~string((string *)&settings.caption);
  std::__cxx11::string::~string((string *)&wtk);
  std::__cxx11::string::~string((string *)&gtk);
  std::__cxx11::string::~string((string *)&nodeNameSpace);
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRGraphicsWindowNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{
  std::string nodeNameSpace = nameSpace;

    std::string gtk = config->getValue("GraphicsToolkit", nodeNameSpace);
  VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(gtk);
    if (gfxToolkit == NULL) {
      std::cerr << "Cannot get the graphics toolkit named: " << gtk << std::endl;
    }

  std::string wtk = config->getValue("WindowToolkit", nameSpace);
    VRWindowToolkit *winToolkit = vrMain->getWindowToolkit(wtk);
    if (winToolkit == NULL) {
      std::cerr << "Cannot get the window toolkit named: " << wtk << std::endl;
    }

  VRWindowSettings settings;
  settings.xpos = config->getValueWithDefault("XPos", 100, nameSpace);
  settings.ypos = config->getValueWithDefault("YPos", 100, nameSpace);
  settings.width = config->getValueWithDefault("Width", 640, nameSpace);
  settings.height = config->getValueWithDefault("Height", 640, nameSpace);
  settings.border = (int)config->getValueWithDefault("Border", 0, nameSpace);
  settings.visible = (int)config->getValueWithDefault("Visible", 0, nameSpace);
  settings.caption = std::string(config->getValueWithDefault("Caption", std::string("MinVR Window"), nameSpace));
  settings.quadBuffered = (int)config->getValueWithDefault("QuadBuffered", 0, nameSpace);
  settings.sharedContextGroupID = int(config->getValueWithDefault("SharedContextGroupID", -1, nameSpace));
  settings.contextVersionMajor = int(config->getValueWithDefault("ContextVersionMajor", 1, nameSpace));
  settings.contextVersionMinor = int(config->getValueWithDefault("ContextVersionMinor", 2, nameSpace));
  settings.rgbBits = int(config->getValueWithDefault("RGBBits", 8, nameSpace));
  settings.alphaBits = int(config->getValueWithDefault("AlphaBits", 8, nameSpace));
  settings.depthBits = int(config->getValueWithDefault("DepthBits", 24, nameSpace));
  settings.stencilBits = int(config->getValueWithDefault("StencilBits", 8, nameSpace));
  settings.fullScreen = int(config->getValueWithDefault("FullScreen", 0, nameSpace));
  settings.resizable = int(config->getValueWithDefault("Resizable", 1, nameSpace));
  settings.allowMaximize = int(config->getValueWithDefault("AllowMaximize", 1, nameSpace));
  settings.gpuAffinity = int(config->getValueWithDefault("UseGPUAffinity", 1, nameSpace));
  settings.debugContext = int(config->getValueWithDefault("UseDebugContext", 0, nameSpace));
  settings.msaaSamples = int(config->getValueWithDefault("MSAASamples", 0, nameSpace));

  //  std::cout << "Window corners: " << settings.xpos << ", " << settings.ypos << ", " << settings.width << ", " << settings.height << std::endl;

  VRDisplayNode *node = new VRGraphicsWindowNode(nameSpace, gfxToolkit, winToolkit, settings);

  return node;
}